

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMBusTypes.cpp
# Opt level: O2

void __thiscall
SMBusPacket::CreateDefaultFrames
          (SMBusPacket *this,SMBusAnalyzerResults *pResults,SMBusProtocol *pProt,bool has_pec,
          SMBusDecodeLevel dec_level)

{
  SMBP_ProtElem SVar1;
  pointer pSVar2;
  ulong uVar3;
  pointer pvVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  bool bVar8;
  uint local_7c;
  long local_68;
  SMBusByte local_60;
  SMBusPacket *local_38;
  
  uVar3 = 1;
  local_68 = 0;
  local_7c = 0xffffffff;
  lVar5 = 0;
  local_38 = this;
  do {
    SVar1 = pProt->prot_elems[uVar3];
    if (SVar1 == SMBP_Stop) {
      if ((has_pec) &&
         (pvVar4 = (this->chunks).
                   super__Vector_base<std::vector<SMBusByte,_std::allocator<SMBusByte>_>,_std::allocator<std::vector<SMBusByte,_std::allocator<SMBusByte>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
         pSVar2 = pvVar4[-1].super__Vector_base<SMBusByte,_std::allocator<SMBusByte>_>._M_impl.
                  super__Vector_impl_data._M_finish,
         (int)((ulong)((long)pSVar2 -
                      (long)pvVar4[-1].super__Vector_base<SMBusByte,_std::allocator<SMBusByte>_>.
                            _M_impl.super__Vector_impl_data._M_start) >> 5) - (int)lVar5 == 1)) {
        CalcPEC(this,true);
        SMBusByte::ToPECFrame(&local_60,(char)pSVar2 + 0xe0);
        AnalyzerResults::AddFrame((Frame *)pResults);
        Frame::~Frame((Frame *)&local_60);
      }
      return;
    }
    if (SMBP_DataBlock < SVar1) goto LAB_001124ec;
    pvVar4 = (this->chunks).
             super__Vector_base<std::vector<SMBusByte,_std::allocator<SMBusByte>_>,_std::allocator<std::vector<SMBusByte,_std::allocator<SMBusByte>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + local_68;
    switch(SVar1) {
    case SMBP_Start:
      local_68 = local_68 + 1;
      lVar5 = 0;
      break;
    case SMBP_Stop:
      goto switchD_0011236d_caseD_1;
    default:
      SMBusByte::ToAddrFrame
                (&local_60,
                 (SMBusProtocol *)
                 (lVar5 * 0x20 +
                 *(long *)&(pvVar4->super__Vector_base<SMBusByte,_std::allocator<SMBusByte>_>).
                           _M_impl.super__Vector_impl_data));
      AnalyzerResults::AddFrame((Frame *)pResults);
      goto LAB_001124da;
    case SMBP_AddrRead:
      SMBusByte::ToAddrFrame
                (&local_60,
                 (SMBusProtocol *)
                 (lVar5 * 0x20 +
                 *(long *)&(pvVar4->super__Vector_base<SMBusByte,_std::allocator<SMBusByte>_>).
                           _M_impl.super__Vector_impl_data));
      AnalyzerResults::AddFrame((Frame *)pResults);
      goto LAB_001124da;
    case SMBP_Command:
      if (dec_level == DL_SmartBattery) {
        SMBusByte::ToSmartBatteryCommandFrame(&local_60);
        AnalyzerResults::AddFrame((Frame *)pResults);
      }
      else if (dec_level == DL_PMBus) {
        SMBusByte::ToPMBusCommandFrame(&local_60);
        AnalyzerResults::AddFrame((Frame *)pResults);
      }
      else {
        SMBusByte::ToSMBusCommandFrame(&local_60);
        AnalyzerResults::AddFrame((Frame *)pResults);
      }
      Frame::~Frame((Frame *)&local_60);
      lVar5 = lVar5 + 1;
      break;
    case SMBP_CommandExt:
      SMBusByte::ToPMBusCommandExtFrame
                (&local_60,
                 (SMBusByte *)
                 (*(long *)&(pvVar4->super__Vector_base<SMBusByte,_std::allocator<SMBusByte>_>).
                            _M_impl.super__Vector_impl_data + lVar5 * 0x20));
      AnalyzerResults::AddFrame((Frame *)pResults);
      goto LAB_001123f4;
    case SMBP_DataByte:
      SMBusByte::ToDataByte
                (&local_60,
                 (int)(lVar5 << 5) +
                 (int)(pvVar4->super__Vector_base<SMBusByte,_std::allocator<SMBusByte>_>)._M_impl.
                      super__Vector_impl_data._M_start);
      AnalyzerResults::AddFrame((Frame *)pResults);
LAB_001124da:
      Frame::~Frame((Frame *)&local_60);
      lVar5 = lVar5 + 1;
switchD_0011236d_caseD_1:
      break;
    case SMBP_DataWord:
      lVar7 = *(long *)&(pvVar4->super__Vector_base<SMBusByte,_std::allocator<SMBusByte>_>)._M_impl.
                        super__Vector_impl_data;
      SMBusByte::ToDataWord
                (&local_60,(SMBusByte *)(lVar7 + lVar5 * 0x20),
                 (int)lVar7 + (int)(lVar5 * 0x20) + 0x20);
      AnalyzerResults::AddFrame((Frame *)pResults);
LAB_001123f4:
      Frame::~Frame((Frame *)&local_60);
      lVar5 = lVar5 + 2;
      break;
    case SMBP_ByteCount:
      SMBusByte::ToByteCount(&local_60);
      AnalyzerResults::AddFrame((Frame *)pResults);
      Frame::~Frame((Frame *)&local_60);
      local_7c = (uint)*(byte *)(*(long *)&(pvVar4->
                                           super__Vector_base<SMBusByte,_std::allocator<SMBusByte>_>
                                           )._M_impl.super__Vector_impl_data + lVar5 * 0x20);
      lVar5 = lVar5 + 1;
      goto switchD_0011236d_caseD_1;
    case SMBP_DataBlock:
      uVar6 = 0;
      if (0 < (int)local_7c) {
        uVar6 = (ulong)local_7c;
      }
      lVar7 = lVar5 << 5;
      while (bVar8 = uVar6 != 0, uVar6 = uVar6 - 1, bVar8) {
        SMBusByte::ToDataByte
                  (&local_60,
                   (int)(pvVar4->super__Vector_base<SMBusByte,_std::allocator<SMBusByte>_>)._M_impl.
                        super__Vector_impl_data._M_start + (int)lVar7);
        AnalyzerResults::AddFrame((Frame *)pResults);
        Frame::~Frame((Frame *)&local_60);
        lVar7 = lVar7 + 0x20;
      }
      lVar5 = lVar5 + (int)local_7c;
      local_7c = 0xffffffff;
      this = local_38;
    }
LAB_001124ec:
    uVar3 = (ulong)(byte)((char)uVar3 + 1);
  } while( true );
}

Assistant:

void SMBusPacket::CreateDefaultFrames( SMBusAnalyzerResults* pResults, const SMBusProtocol* pProt, bool has_pec,
                                       SMBusDecodeLevel dec_level ) const
{
    const SMBP_ProtElem* pProtElems = pProt->prot_elems;

    U8 prot_elem_ndx = 1; // skip the initial Start

    size_t bcnt = 0, chnkcnt = 0;
    bool should_end_on_nack = false;
    int byte_count = -1;
    while( pProtElems[ prot_elem_ndx ] != SMBP_Stop )
    {
        const std::vector<SMBusByte>& chunk( chunks[ chnkcnt ] );

        switch( pProtElems[ prot_elem_ndx ] )
        {
        case SMBP_Start:
            bcnt = 0;
            ++chnkcnt;
            break;
        case SMBP_AddrAny:
        case SMBP_AddrWrite:
        case SMBP_AddrHostWrite:
            pResults->AddFrame( chunk[ bcnt ].ToAddrFrame( pProt ) );
            ++bcnt;
            should_end_on_nack = false;
            break;
        case SMBP_AddrRead:
            pResults->AddFrame( chunk[ bcnt ].ToAddrFrame( pProt ) );
            ++bcnt;
            should_end_on_nack = true;
            break;
        case SMBP_Command:
            if( dec_level == DL_PMBus )
                pResults->AddFrame( chunk[ bcnt ].ToPMBusCommandFrame() );
            else if( dec_level == DL_SmartBattery )
                pResults->AddFrame( chunk[ bcnt ].ToSmartBatteryCommandFrame() );
            else
                pResults->AddFrame( chunk[ bcnt ].ToSMBusCommandFrame() );

            ++bcnt;
            break;
        case SMBP_CommandExt:
            pResults->AddFrame( chunk[ bcnt ].ToPMBusCommandExtFrame( chunk[ bcnt + 1 ] ) );
            bcnt += 2;
            break;
        case SMBP_DataByte:
            pResults->AddFrame( chunk[ bcnt ].ToDataByte() );
            ++bcnt;
            break;
        case SMBP_DataWord:
            pResults->AddFrame( chunk[ bcnt ].ToDataWord( chunk[ bcnt + 1 ] ) );
            bcnt += 2;
            break;
        case SMBP_ByteCount:
            pResults->AddFrame( chunk[ bcnt ].ToByteCount() );
            byte_count = chunk[ bcnt ].value;
            ++bcnt;
            break;
        case SMBP_DataBlock:

            // create byte blocks
            int c;
            for( c = 0; c < byte_count; ++c )
                pResults->AddFrame( chunk[ bcnt + c ].ToDataByte() );

            bcnt += byte_count;

            byte_count = -1;

            break;
        }

        ++prot_elem_ndx;
    }

    int bytes_remaining = chunks.back().size() - bcnt;

    if( has_pec && bytes_remaining == 1 )
        pResults->AddFrame( chunks.back().back().ToPECFrame( CalcPEC( has_pec ) ) );
}